

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonsugar.hpp
# Opt level: O3

void __thiscall
nonsugar::detail::parse_flag_long<std::__cxx11::string,int,void>::operator()
          (parse_flag_long<std::__cxx11::string,int,void> *this,
          match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          *match,__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *arg_it,
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          arg_last,shared_ptr<int> *value,
          flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__g_,_int>
          *flg,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *err)

{
  undefined8 *puVar1;
  shared_ptr<int> *psVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  pointer psVar4;
  undefined8 *puVar5;
  long *plVar6;
  undefined8 uVar7;
  size_type *psVar8;
  long lVar9;
  ulong uVar10;
  element_type *peVar11;
  shared_ptr<int> v;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> s;
  string_type local_120;
  shared_ptr<int> *local_100;
  long local_f8;
  shared_ptr<int> local_f0;
  string_type local_e0;
  element_type **local_c0;
  long local_b8;
  element_type *local_b0 [2];
  string_type local_a0;
  ulong *local_80;
  long local_78;
  ulong local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  local_48 = 0;
  local_40 = 0;
  psVar4 = (match->
           super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ).
           super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar9 = (long)(match->
                super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ).
                super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)psVar4;
  if ((lVar9 == 0) || (0xfffffffffffffffc < (lVar9 >> 3) * -0x5555555555555555 - 6U)) {
    psVar4 = (pointer)((long)psVar4 + lVar9 + -0x48);
  }
  else {
    psVar4 = psVar4 + 2;
  }
  local_50 = &local_40;
  if (psVar4->matched == false) {
    pbVar3 = arg_it->_M_current;
    arg_it->_M_current = pbVar3 + 1;
    if (pbVar3 + 1 == arg_last._M_current) {
      local_100 = &local_f0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"argument required: ","")
      ;
      std::__cxx11::
      match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::str(&local_120,match,0);
      peVar11 = (element_type *)0xf;
      if (local_100 != &local_f0) {
        peVar11 = local_f0.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      }
      if (peVar11 < (element_type *)(local_120._M_string_length + local_f8)) {
        uVar7 = (element_type *)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120._M_dataplus._M_p != &local_120.field_2) {
          uVar7 = local_120.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar7 < (element_type *)(local_120._M_string_length + local_f8))
        goto LAB_0014e7bf;
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_120,0,(char *)0x0,(ulong)local_100);
      }
      else {
LAB_0014e7bf:
        puVar5 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_100,(ulong)local_120._M_dataplus._M_p);
      }
      local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
      psVar8 = puVar5 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_e0.field_2._M_allocated_capacity = *psVar8;
        local_e0.field_2._8_8_ = puVar5[3];
      }
      else {
        local_e0.field_2._M_allocated_capacity = *psVar8;
        local_e0._M_dataplus._M_p = (pointer)*puVar5;
      }
      local_e0._M_string_length = puVar5[1];
      *puVar5 = psVar8;
      puVar5[1] = 0;
      *(undefined1 *)psVar8 = 0;
      std::__cxx11::string::operator=((string *)err,(string *)&local_e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != &local_120.field_2) {
        operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
      }
      if (local_100 != &local_f0) {
        operator_delete(local_100,
                        (long)local_f0.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                        1);
      }
      goto LAB_0014ea0e;
    }
    std::__cxx11::string::_M_assign((string *)&local_50);
  }
  else {
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::str(&local_e0,match,2);
    std::__cxx11::string::operator=((string *)&local_50,(string *)&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
  }
  if ((flg->read).super__Function_base._M_manager == (_Manager_type)0x0) {
    uVar7 = std::__throw_bad_function_call();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
    }
    if (local_100 != value) {
      operator_delete(local_100,
                      (long)local_f0.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1)
      ;
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    _Unwind_Resume(uVar7);
  }
  (*(flg->read)._M_invoker)
            ((_Any_data *)local_60,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&flg->read);
  if ((element_type *)local_60._0_8_ == (element_type *)0x0) {
    local_80 = local_70;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"invalid argument: --","");
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::str(&local_a0,match,1);
    uVar10 = 0xf;
    if (local_80 != local_70) {
      uVar10 = local_70[0];
    }
    if (uVar10 < local_a0._M_string_length + local_78) {
      uVar7 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        uVar7 = local_a0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar7 < local_a0._M_string_length + local_78) goto LAB_0014e734;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_a0,0,(char *)0x0,(ulong)local_80);
    }
    else {
LAB_0014e734:
      puVar5 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_80,(ulong)local_a0._M_dataplus._M_p);
    }
    local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
    puVar1 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar1) {
      local_120.field_2._M_allocated_capacity = *puVar1;
      local_120.field_2._8_4_ = *(undefined4 *)(puVar5 + 3);
      local_120.field_2._12_4_ = *(undefined4 *)((long)puVar5 + 0x1c);
    }
    else {
      local_120.field_2._M_allocated_capacity = *puVar1;
      local_120._M_dataplus._M_p = (pointer)*puVar5;
    }
    local_120._M_string_length = puVar5[1];
    *puVar5 = puVar1;
    puVar5[1] = 0;
    *(undefined1 *)puVar1 = 0;
    local_c0 = local_b0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"=","");
    uVar7 = (element_type *)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      uVar7 = local_120.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar7 < (element_type *)(local_b8 + local_120._M_string_length)) {
      peVar11 = (element_type *)0xf;
      if (local_c0 != local_b0) {
        peVar11 = local_b0[0];
      }
      if (peVar11 < (element_type *)(local_b8 + local_120._M_string_length)) goto LAB_0014e88b;
      plVar6 = (long *)std::__cxx11::string::replace
                                 ((ulong)&local_c0,0,(char *)0x0,(ulong)local_120._M_dataplus._M_p);
    }
    else {
LAB_0014e88b:
      plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_120,(ulong)local_c0);
    }
    local_100 = &local_f0;
    psVar2 = (shared_ptr<int> *)(plVar6 + 2);
    if ((shared_ptr<int> *)*plVar6 == psVar2) {
      local_f0.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (psVar2->super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_f0.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar6[3];
    }
    else {
      local_f0.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (psVar2->super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_100 = (shared_ptr<int> *)*plVar6;
    }
    local_f8 = plVar6[1];
    *plVar6 = (long)psVar2;
    plVar6[1] = 0;
    *(undefined1 *)&(psVar2->super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_100,(ulong)local_50);
    psVar8 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_e0.field_2._M_allocated_capacity = *psVar8;
      local_e0.field_2._8_8_ = puVar5[3];
      local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    }
    else {
      local_e0.field_2._M_allocated_capacity = *psVar8;
      local_e0._M_dataplus._M_p = (pointer)*puVar5;
    }
    local_e0._M_string_length = puVar5[1];
    *puVar5 = psVar8;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    std::__cxx11::string::operator=((string *)err,(string *)&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    if (local_100 != &local_f0) {
      operator_delete(local_100,
                      (long)local_f0.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1)
      ;
    }
    if (local_c0 != local_b0) {
      operator_delete(local_c0,(long)local_b0[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    if (local_80 != local_70) {
      operator_delete(local_80,local_70[0] + 1);
    }
  }
  else {
    (value->super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         (element_type *)local_60._0_8_;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(value->super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>)._M_refcount,
               (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_60 + 8));
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_);
  }
LAB_0014ea0e:
  if (local_50 != &local_40) {
    operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
  }
  return;
}

Assistant:

void operator()(
        std::match_results<typename String::const_iterator> const &match,
        Iterator &arg_it, Iterator arg_last,
        std::shared_ptr<Value> &value, Flag const &flg, String &err) const
    {
        String s;
        if (!match[2].matched) {
            ++arg_it;
            if (arg_it == arg_last) {
                err = widen<String>("argument required: ") + match.str(0);
                return;
            }
            s = *arg_it;
        } else {
            s = match.str(2);
        }
        auto const v = flg.read(s);
        if (!v) {
            err = widen<String>("invalid argument: --") + match.str(1) + widen<String>("=") + s;
            return;
        }
        value = v;
    }